

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

bool __thiscall StatsByIP::RegisterNewOption(StatsByIP *this,uint16_t option_code)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  bool ret;
  uint64_t bit_mask;
  uint32_t option_hash;
  uint16_t option_code_local;
  StatsByIP *this_local;
  
  uVar1 = (uint)option_code * 0x66 ^ (uint)option_code;
  uVar1 = (uVar1 >> 0xb ^ uVar1) * 0x1f;
  uVar2 = 1L << (((byte)(uVar1 >> 6) ^ (byte)uVar1) & 0x3f);
  bVar3 = (this->option_mask & uVar2) == 0;
  if (bVar3) {
    this->option_mask = uVar2 | this->option_mask;
  }
  return bVar3;
}

Assistant:

bool StatsByIP::RegisterNewOption(uint16_t option_code)
{
    uint32_t option_hash = option_code;

    /* Compute a minimal 16 bit hash */
    option_hash ^= (option_code * 102);
    option_hash ^= (option_hash >> 11);
    option_hash *= 31;
    option_hash ^= (option_hash >> 6);

    /* Retain only the last 6 bits */
    option_hash &= 0x3F;
    uint64_t bit_mask = (1ull << option_hash);

    /* check the mask */
    bool ret = (option_mask&bit_mask) == 0;

    if (ret) {
        option_mask |= bit_mask;
    }

    return ret;
}